

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdflib.cpp
# Opt level: O0

void E0000(int IENTRY,int *status,double *x,double *fx,unsigned_long *qleft,unsigned_long *qhi,
          double *zabsst,double *zabsto,double *zbig,double *zrelst,double *zrelto,double *zsmall,
          double *zstpmu)

{
  bool local_88;
  bool local_87;
  bool local_86;
  bool local_85;
  bool local_84;
  bool local_83;
  bool local_82;
  bool local_81;
  bool local_71;
  allocator<char> local_59;
  string local_58;
  unsigned_long *local_38;
  unsigned_long *qhi_local;
  unsigned_long *qleft_local;
  double *fx_local;
  double *x_local;
  int *status_local;
  int IENTRY_local;
  
  if ((IENTRY != 0) && (IENTRY == 1)) {
    E0000::absstp = *zabsst;
    E0000::abstol = *zabsto;
    E0000::big = *zbig;
    E0000::relstp = *zrelst;
    E0000::reltol = *zrelto;
    E0000::small = *zsmall;
    E0000::stpmul = *zstpmu;
    return;
  }
  local_38 = qhi;
  qhi_local = qleft;
  qleft_local = (unsigned_long *)fx;
  fx_local = x;
  x_local = (double *)status;
  status_local._4_4_ = IENTRY;
  if (*status < 1) {
    local_71 = false;
    if (E0000::small <= *x) {
      local_71 = *x <= E0000::big;
    }
    E0000::qcond = (unsigned_long)((local_71 ^ 0xffU) & 1);
    if (E0000::qcond != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58," SMALL, X, BIG not monotone in INVR",&local_59);
      ftnstop(&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
    }
    E0000::xsave = *fx_local;
    *fx_local = E0000::small;
    E0000::i99999 = 1;
  }
  else {
    switch(E0000::i99999) {
    case 1:
      E0000::fsmall = *fx;
      *x = E0000::big;
      E0000::i99999 = 2;
      break;
    case 2:
      E0000::fbig = *fx;
      E0000::qincr = (unsigned_long)(E0000::fsmall < E0000::fbig);
      if (E0000::qincr == 0) {
        if (E0000::fsmall < 0.0) {
          *status = -1;
          *qleft = 1;
          *qhi = 0;
          return;
        }
        if (0.0 < E0000::fbig) {
          *status = -1;
          *qleft = 0;
          *qhi = 1;
          return;
        }
      }
      else {
        if (0.0 < E0000::fsmall) {
          *status = -1;
          *qhi = 1;
          *qleft = 1;
          return;
        }
        if (E0000::fbig < 0.0) {
          *status = -1;
          *qhi = 0;
          *qleft = 0;
          return;
        }
      }
      *x = E0000::xsave;
      E0000::step = fifdmax1(E0000::absstp,E0000::relstp * ABS(*x));
      E0000::i99999 = 3;
      break;
    case 3:
      E0000::yy = *fx;
      if ((E0000::yy == 0.0) && (!NAN(E0000::yy))) {
        *status = 0;
        return;
      }
      if ((E0000::qincr == 0) || (local_81 = true, 0.0 <= E0000::yy)) {
        local_82 = E0000::qincr == 0 && 0.0 < E0000::yy;
        local_81 = local_82;
      }
      E0000::qup = (unsigned_long)local_81;
      if (E0000::qup == 0) {
        E0000::xub = E0000::xsave;
        E0000::xlb = fifdmax1(E0000::xsave - E0000::step,E0000::small);
        goto LAB_001d36ed;
      }
      E0000::xlb = E0000::xsave;
      E0000::xub = fifdmin1(E0000::xsave + E0000::step,E0000::big);
LAB_001d3518:
      *fx_local = E0000::xub;
      E0000::i99999 = 4;
      break;
    case 4:
      E0000::yy = *fx;
      if ((E0000::qincr == 0) || (local_83 = true, E0000::yy < 0.0)) {
        local_84 = E0000::qincr == 0 && E0000::yy <= 0.0;
        local_83 = local_84;
      }
      E0000::qbdd = (unsigned_long)local_83;
      E0000::qlim = (unsigned_long)(E0000::big <= E0000::xub);
      local_85 = E0000::qbdd != 0 || E0000::qlim != 0;
      E0000::qcond = (unsigned_long)local_85;
      if (E0000::qcond == 0) {
        E0000::step = E0000::stpmul * E0000::step;
        E0000::xlb = E0000::xub;
        E0000::xub = fifdmin1(E0000::xub + E0000::step,E0000::big);
      }
      if (E0000::qcond == 0) goto LAB_001d3518;
      if ((E0000::qlim != 0) && (E0000::qbdd == 0)) {
        *(undefined4 *)x_local = 0xffffffff;
        *qhi_local = 0;
        *local_38 = (ulong)((E0000::qincr != 0 ^ 0xffU) & 1);
        *fx_local = E0000::big;
        return;
      }
LAB_001d386e:
      dstzr(&E0000::xlb,&E0000::xub,&E0000::abstol,&E0000::reltol);
      *(undefined4 *)x_local = 0;
      while (dzror((int *)x_local,fx_local,(double *)qleft_local,&E0000::xlo,&E0000::xhi,
                   &E0000::qdum1,&E0000::qdum2), *(int *)x_local != 1) {
LAB_001d389b:
        if (*(int *)x_local != 1) {
          *fx_local = E0000::xlo;
          *(undefined4 *)x_local = 0;
          return;
        }
      }
      E0000::i99999 = 6;
      break;
    case 5:
      E0000::yy = *fx;
      if ((E0000::qincr == 0) || (local_86 = true, 0.0 < E0000::yy)) {
        local_87 = E0000::qincr == 0 && 0.0 <= E0000::yy;
        local_86 = local_87;
      }
      E0000::qbdd = (unsigned_long)local_86;
      E0000::qlim = (unsigned_long)(E0000::xlb <= E0000::small);
      local_88 = E0000::qbdd != 0 || E0000::qlim != 0;
      E0000::qcond = (unsigned_long)local_88;
      if (E0000::qcond == 0) {
        E0000::step = E0000::stpmul * E0000::step;
        E0000::xub = E0000::xlb;
        E0000::xlb = fifdmax1(E0000::xlb - E0000::step,E0000::small);
      }
      if (E0000::qcond != 0) {
        if ((E0000::qlim != 0) && (E0000::qbdd == 0)) {
          *(undefined4 *)x_local = 0xffffffff;
          *qhi_local = 1;
          *local_38 = E0000::qincr;
          *fx_local = E0000::small;
          return;
        }
        goto LAB_001d386e;
      }
LAB_001d36ed:
      *fx_local = E0000::xlb;
      E0000::i99999 = 5;
      break;
    case 6:
      goto LAB_001d389b;
    default:
      goto switchD_001d39bf_default;
    }
  }
  *(undefined4 *)x_local = 1;
switchD_001d39bf_default:
  return;
}

Assistant:

void E0000 ( int IENTRY, int *status, double *x, double *fx,
  unsigned long *qleft, unsigned long *qhi, double *zabsst,
  double *zabsto, double *zbig, double *zrelst,
  double *zrelto, double *zsmall, double *zstpmu )

//****************************************************************************80
//
//  Purpose:
//
//    E0000 is a reverse-communication zero bounder.
//
{
# define qxmon(zx,zy,zz) int((zx) <= (zy) && (zy) <= (zz))

  static double absstp;
  static double abstol;
  static double big,fbig,fsmall,relstp,reltol,small,step,stpmul,xhi,
    xlb,xlo,xsave,xub,yy;
  static int i99999;
  static unsigned long qbdd,qcond,qdum1,qdum2,qincr,qlim,qup;
    switch(IENTRY){case 0: goto DINVR; case 1: goto DSTINV;}
DINVR:
    if(*status > 0) goto S310;
    qcond = !qxmon(small,*x,big);
    if(qcond) 
    {
      ftnstop(" SMALL, X, BIG not monotone in INVR");
    }
    xsave = *x;
//
//     See that SMALL and BIG bound the zero and set QINCR
//
    *x = small;
//
//     GET-FUNCTION-VALUE
//
    i99999 = 1;
    goto S300;
S10:
    fsmall = *fx;
    *x = big;
//
//     GET-FUNCTION-VALUE
//
    i99999 = 2;
    goto S300;
S20:
    fbig = *fx;
    qincr = fbig > fsmall;
    if(!qincr) goto S50;
    if(fsmall <= 0.0e0) goto S30;
    *status = -1;
    *qleft = *qhi = 1;
    return;
S30:
    if(fbig >= 0.0e0) goto S40;
    *status = -1;
    *qleft = *qhi = 0;
    return;
S40:
    goto S80;
S50:
    if(fsmall >= 0.0e0) goto S60;
    *status = -1;
    *qleft = 1;
    *qhi = 0;
    return;
S60:
    if(fbig <= 0.0e0) goto S70;
    *status = -1;
    *qleft = 0;
    *qhi = 1;
    return;
S80:
S70:
    *x = xsave;
    step = fifdmax1(absstp,relstp*fabs(*x));
//
//      YY = F(X) - Y
//     GET-FUNCTION-VALUE
//
    i99999 = 3;
    goto S300;
S90:
    yy = *fx;
    if(!(yy == 0.0e0)) goto S100;
    *status = 0;
    return;
S100:
    qup = (qincr && yy < 0.0e0) || (!qincr && yy > 0.0e0);
//
//     HANDLE CASE IN WHICH WE MUST STEP HIGHER
//
    if(!qup) goto S170;
    xlb = xsave;
    xub = fifdmin1(xlb+step,big);
    goto S120;
S110:
    if(qcond) goto S150;
S120:
//
//      YY = F(XUB) - Y
//
    *x = xub;
//
//     GET-FUNCTION-VALUE
//
    i99999 = 4;
    goto S300;
S130:
    yy = *fx;
    qbdd = (qincr && yy >= 0.0e0) || (!qincr && yy <= 0.0e0);
    qlim = xub >= big;
    qcond = qbdd || qlim;
    if(qcond) goto S140;
    step = stpmul*step;
    xlb = xub;
    xub = fifdmin1(xlb+step,big);
S140:
    goto S110;
S150:
    if(!(qlim && !qbdd)) goto S160;
    *status = -1;
    *qleft = 0;
    *qhi = !qincr;
    *x = big;
    return;
S160:
    goto S240;
S170:
//
//     HANDLE CASE IN WHICH WE MUST STEP LOWER
//
    xub = xsave;
    xlb = fifdmax1(xub-step,small);
    goto S190;
S180:
    if(qcond) goto S220;
S190:
//
//      YY = F(XLB) - Y
//
    *x = xlb;
//
//     GET-FUNCTION-VALUE
//
    i99999 = 5;
    goto S300;
S200:
    yy = *fx;
    qbdd = (qincr && yy <= 0.0e0) || (!qincr && yy >= 0.0e0);
    qlim = xlb <= small;
    qcond = qbdd || qlim;
    if(qcond) goto S210;
    step = stpmul*step;
    xub = xlb;
    xlb = fifdmax1(xub-step,small);
S210:
    goto S180;
S220:
    if(!(qlim && !qbdd)) goto S230;
    *status = -1;
    *qleft = 1;
    *qhi = qincr;
    *x = small;
    return;
S240:
S230:
    dstzr(&xlb,&xub,&abstol,&reltol);
//
//  IF WE REACH HERE, XLB AND XUB BOUND THE ZERO OF F.
//
    *status = 0;
    goto S260;
S250:
    if(!(*status == 1)) goto S290;
S260:
    dzror ( status, x, fx, &xlo, &xhi, &qdum1, &qdum2 );
    if(!(*status == 1)) goto S280;
//
//     GET-FUNCTION-VALUE
//
    i99999 = 6;
    goto S300;
S280:
S270:
    goto S250;
S290:
    *x = xlo;
    *status = 0;
    return;
DSTINV:
    small = *zsmall;
    big = *zbig;
    absstp = *zabsst;
    relstp = *zrelst;
    stpmul = *zstpmu;
    abstol = *zabsto;
    reltol = *zrelto;
    return;
S300:
//
//     TO GET-FUNCTION-VALUE
//
    *status = 1;
    return;
S310:
    switch(int(i99999)){case 1: goto S10;case 2: goto S20;case 3: goto S90;case
      4: goto S130;case 5: goto S200;case 6: goto S270;default: break;}
# undef qxmon
}